

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_rapt.cc
# Opt level: O0

bool __thiscall
sptk::PitchExtractionByRapt::Get
          (PitchExtractionByRapt *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  int target_length;
  int tmp_length;
  float *tmp_f0;
  int *in_stack_000031e0;
  float **in_stack_000031e8;
  double in_stack_000031f0;
  double in_stack_000031f8;
  double in_stack_00003200;
  double in_stack_00003208;
  int in_stack_00003214;
  vector<double,_std::allocator<double>_> *in_stack_00003218;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  int local_3c;
  float *local_38;
  bool local_1;
  
  if ((((ulong)(((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x30))->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_start & 1) == 0) ||
     (bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)in_RDI._M_current), bVar1)) {
    local_1 = false;
  }
  else {
    if (in_RDX != 0) {
      iVar2 = snack::cGet_f0(in_stack_00003218,in_stack_00003214,in_stack_00003208,in_stack_00003200
                             ,in_stack_000031f8,in_stack_000031f0,in_stack_000031e8,
                             in_stack_000031e0);
      if (iVar2 != 0) {
        return false;
      }
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
      auVar5._8_4_ = (int)(sVar3 >> 0x20);
      auVar5._0_8_ = sVar3;
      auVar5._12_4_ = 0x45300000;
      dVar4 = ceil(((auVar5._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) /
                   (double)*(int *)&(((vector<double,_std::allocator<double>_> *)in_RDI._M_current)
                                    ->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_finish);
      if ((int)dVar4 < local_3c) {
        local_3c = (int)dVar4;
      }
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98._M_current);
      __last._M_current = (double *)(local_38 + local_3c);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      std::
      copy<float*,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((float *)in_RDI._M_current,(float *)__last._M_current,in_stack_ffffffffffffff98);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff78);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                __last._M_current,(difference_type)local_38);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff78);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,float>
                (in_RDI,__last,local_38);
      snack::ckfree((void *)0x10bee7);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PitchExtractionByRapt::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    float* tmp_f0;
    int tmp_length;
    if (0 != snack::cGet_f0(waveform, frame_shift_, sampling_rate_, lower_f0_,
                            upper_f0_, voicing_threshold_, &tmp_f0,
                            &tmp_length)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_length = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0, tmp_f0 + tmp_length, f0->begin());
    std::fill(f0->begin() + tmp_length, f0->end(), tmp_f0[tmp_length - 1]);
    snack::ckfree(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}